

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::FboCases::TexSubImageAfterRenderTest::render
          (TexSubImageAfterRenderTest *this,Context *context,Surface *dst)

{
  GLenum GVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  PixelBufferAccess local_208;
  TextureLevel metaballs;
  Vec3 local_1b8;
  TextureLevel fourQuads;
  SingleTex2DShader shader;
  
  SingleTex2DShader::SingleTex2DShader(&shader);
  uVar2 = (*context->_vptr_Context[0x75])(context,&shader);
  GVar1 = (this->super_FboRenderCase).m_config.colorbufferFormat;
  metaballs.m_format.order = RGB;
  metaballs.m_format.type = UNORM_INT8;
  tcu::TextureLevel::TextureLevel(&fourQuads,&metaballs.m_format,0x40,0x40,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&metaballs,&fourQuads);
  tcu::fillWithRGBAQuads((PixelBufferAccess *)&metaballs);
  local_208.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
  local_208.super_ConstPixelBufferAccess.m_format.order = (GVar1 == 0x1908) + RGB;
  tcu::TextureLevel::TextureLevel(&metaballs,(TextureFormat *)&local_208,0x40,0x40,1);
  tcu::TextureLevel::getAccess(&local_208,&metaballs);
  tcu::fillWithMetaballs(&local_208,5,3);
  (*context->_vptr_Context[0x76])(context,(ulong)uVar2);
  uVar3 = (*context->_vptr_Context[0x66])(context,(ulong)uVar2,"u_sampler0");
  (*context->_vptr_Context[0x5b])(context,(ulong)uVar3,0);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x1d])(context,0xde1,0x2801,0x2601);
  tcu::TextureLevel::getAccess(&local_208,&fourQuads);
  (*context->_vptr_Context[0x11])
            (context,0xde1,0,0x1907,0x40,0x40,0,0x1907,0x1401,
             local_208.super_ConstPixelBufferAccess.m_data);
  (*context->_vptr_Context[9])(context,0x8d40,1);
  (*context->_vptr_Context[6])(context,0xde1,2);
  uVar5 = (ulong)((GVar1 == 0x1908) + 0x1907);
  (*context->_vptr_Context[0x7e])(context,0xde1,0,uVar5,0x80,0x80);
  (*context->_vptr_Context[0x1d])(context,0xde1,0x2801,0x2601);
  (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,2,0);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  (*context->_vptr_Context[6])(context,0xde1,1);
  local_208.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
  local_208.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
  local_208.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  local_1b8.m_data[0] = 1.0;
  local_1b8.m_data[1] = 1.0;
  local_1b8.m_data[2] = 0.0;
  sglr::drawQuad(context,uVar2,(Vec3 *)&local_208,&local_1b8);
  (*context->_vptr_Context[6])(context,0xde1,2);
  tcu::TextureLevel::getAccess(&local_208,&metaballs);
  (*context->_vptr_Context[0x14])
            (context,0xde1,0,0x20,0x20,0x40,0x40,uVar5,0x1401,
             local_208.super_ConstPixelBufferAccess.m_data);
  (*context->_vptr_Context[9])(context,0x8d40,0);
  uVar3 = (*context->_vptr_Context[2])(context);
  uVar4 = (*context->_vptr_Context[3])(context);
  (*context->_vptr_Context[5])(context,0,0,(ulong)uVar3,(ulong)uVar4);
  local_208.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
  local_208.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
  local_208.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  local_1b8.m_data[0] = 1.0;
  local_1b8.m_data[1] = 1.0;
  local_1b8.m_data[2] = 0.0;
  sglr::drawQuad(context,uVar2,(Vec3 *)&local_208,&local_1b8);
  uVar2 = (*context->_vptr_Context[2])(context);
  uVar3 = (*context->_vptr_Context[3])(context);
  (*context->_vptr_Context[0x80])(context,dst,0,0,(ulong)uVar2,(ulong)uVar3);
  tcu::TextureLevel::~TextureLevel(&metaballs);
  tcu::TextureLevel::~TextureLevel(&fourQuads);
  sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
  return;
}

Assistant:

void TexSubImageAfterRenderTest::render (sglr::Context& context, Surface& dst)
{
	SingleTex2DShader	shader;
	deUint32			shaderID	= context.createProgram(&shader);
	bool				isRGBA		= getConfig().colorbufferFormat == GL_RGBA;

	tcu::TextureLevel fourQuads(tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), 64, 64);
	tcu::fillWithRGBAQuads(fourQuads.getAccess());

	tcu::TextureLevel metaballs(tcu::TextureFormat(isRGBA ? tcu::TextureFormat::RGBA : tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), 64, 64);
	tcu::fillWithMetaballs(metaballs.getAccess(), 5, 3);

	shader.setUnit(context, shaderID, 0);

	deUint32 fourQuadsTex = 1;
	context.bindTexture(GL_TEXTURE_2D, fourQuadsTex);
	context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	context.texImage2D(GL_TEXTURE_2D, 0, GL_RGB, 64, 64, 0, GL_RGB, GL_UNSIGNED_BYTE, fourQuads.getAccess().getDataPtr());

	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	deUint32 fboTex = 2;
	context.bindTexture(GL_TEXTURE_2D, fboTex);
	context.texImage2D(GL_TEXTURE_2D, 0, isRGBA ? GL_RGBA : GL_RGB, 128, 128);
	context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, fboTex, 0);

	// Render to fbo
	context.viewport(0, 0, 128, 128);
	context.bindTexture(GL_TEXTURE_2D, fourQuadsTex);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	// Update texture using TexSubImage2D
	context.bindTexture(GL_TEXTURE_2D, fboTex);
	context.texSubImage2D(GL_TEXTURE_2D, 0, 32, 32, 64, 64, isRGBA ? GL_RGBA : GL_RGB, GL_UNSIGNED_BYTE, metaballs.getAccess().getDataPtr());

	// Draw to screen
	context.bindFramebuffer(GL_FRAMEBUFFER, 0);
	context.viewport(0, 0, context.getWidth(), context.getHeight());
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
}